

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

qreal __thiscall QGraphicsItem::boundingRegionGranularity(QGraphicsItem *this)

{
  QGraphicsItemPrivate *this_00;
  long in_FS_OFFSET;
  qreal qVar1;
  QVariant local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  qVar1 = 0.0;
  if ((this_00->field_0x162 & 0x80) != 0) {
    QGraphicsItemPrivate::extra(&local_30,this_00,ExtraBoundingRegionGranularity);
    qVar1 = qvariant_cast<double>(&local_30);
    ::QVariant::~QVariant(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qreal QGraphicsItem::boundingRegionGranularity() const
{
    return d_ptr->hasBoundingRegionGranularity
        ? qvariant_cast<qreal>(d_ptr->extra(QGraphicsItemPrivate::ExtraBoundingRegionGranularity))
        : 0;
}